

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O1

void __thiscall randomx::JitCompilerX86::h_CBRANCH(JitCompilerX86 *this,Instruction *instr,int i)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  long lVar6;
  uint8_t uVar7;
  int iVar8;
  
  bVar2 = instr->dst;
  iVar3 = this->registerUsage[bVar2];
  puVar5 = this->code;
  iVar8 = this->codePos;
  (puVar5 + iVar8)[0] = 'I';
  (puVar5 + iVar8)[1] = 0x81;
  iVar8 = this->codePos + 2;
  this->codePos = iVar8;
  uVar7 = bVar2 - 0x40;
  this->code[iVar8] = uVar7;
  iVar8 = this->codePos;
  this->codePos = iVar8 + 1;
  bVar2 = instr->mod >> 4;
  *(uint32_t *)(this->code + (long)iVar8 + 1) = ~(0x80 << bVar2) & (0x100 << bVar2 | instr->imm32);
  iVar8 = this->codePos + 4;
  this->codePos = iVar8;
  puVar5 = this->code;
  (puVar5 + iVar8)[0] = 'I';
  (puVar5 + iVar8)[1] = 0xf7;
  iVar8 = this->codePos + 2;
  this->codePos = iVar8;
  this->code[iVar8] = uVar7;
  iVar8 = this->codePos;
  this->codePos = iVar8 + 1;
  *(int *)(this->code + (long)iVar8 + 1) = 0xff00 << bVar2;
  iVar8 = this->codePos + 4;
  this->codePos = iVar8;
  puVar5 = this->code;
  (puVar5 + iVar8)[0] = '\x0f';
  (puVar5 + iVar8)[1] = 0x84;
  iVar4 = this->codePos;
  iVar8 = iVar4 + 2;
  this->codePos = iVar8;
  *(int *)(this->code + iVar8) =
       ((this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(long)iVar3 + 1] - iVar4) + -6;
  this->codePos = this->codePos + 4;
  lVar6 = 0;
  do {
    piVar1 = this->registerUsage + lVar6;
    *piVar1 = i;
    piVar1[1] = i;
    piVar1[2] = i;
    piVar1[3] = i;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 8);
  return;
}

Assistant:

void JitCompilerX86::h_CBRANCH(Instruction& instr, int i) {
		int reg = instr.dst;
		int target = registerUsage[reg] + 1;
		emit(REX_ADD_I);
		emitByte(0xc0 + reg);
		int shift = instr.getModCond() + ConditionOffset;
		uint32_t imm = instr.getImm32() | (1UL << shift);
		if (ConditionOffset > 0 || shift > 0)
			imm &= ~(1UL << (shift - 1));
		emit32(imm);
		emit(REX_TEST);
		emitByte(0xc0 + reg);
		emit32(ConditionMask << shift);
		emit(JZ);
		emit32(instructionOffsets[target] - (codePos + 4));
		//mark all registers as used
		for (unsigned j = 0; j < RegistersCount; ++j) {
			registerUsage[j] = i;
		}
	}